

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# was_added.c
# Opt level: O3

int was_added(pair_t **l,uint32 src)

{
  pair_t *c;
  pair_t *ppVar1;
  
  ppVar1 = *l;
  while( true ) {
    if (ppVar1 == (pair_t *)0x0) {
      ppVar1 = (pair_t *)
               __ckd_calloc__(1,0x10,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/was_added.c"
                              ,0xa7);
      ppVar1->src_id = src;
      ppVar1->next = *l;
      *l = ppVar1;
      return 0;
    }
    if (ppVar1->src_id == src) break;
    ppVar1 = ppVar1->next;
  }
  return 1;
}

Assistant:

int
was_added(pair_t **l,
	  uint32 src)
{
    pair_t *new;
    int ret;

    /* see if given src has been added to the destination yet or not */
    ret = find_added(*l, src);

    if (ret == FALSE) {
	/* it hasn't, so prepend an entry for it on the list */

	new = (pair_t *)ckd_calloc(1, sizeof(pair_t));

	new->src_id = src;
    
	new->next = *l;
	*l = new;
    }

    return ret;
}